

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O0

void __thiscall ELLIPSOID::ELLIPSOID(ELLIPSOID *this,double a_,double b_)

{
  double b__local;
  double a__local;
  ELLIPSOID *this_local;
  
  this->a = a_;
  this->b = b_;
  this->c = (this->a * this->a) / this->b;
  this->alpha = (this->a - this->b) / this->a;
  this->e2 = (this->a * this->a + -(this->b * this->b)) / (this->a * this->a);
  this->e1_2 = (this->a * this->a + -(this->b * this->b)) / (this->b * this->b);
  return;
}

Assistant:

ELLIPSOID::ELLIPSOID(double a_, double b_)
{
    this->a = a_;
    this->b = b_;
    this->c = this->a * this->a / this->b;
    this->alpha = (this->a - this->b) / this->a;
    this->e2 = (this->a * this->a - this->b * this->b) / (this->a * this->a);
    this->e1_2 = (this->a * this->a - this->b * this->b) / (this->b * this->b);
}